

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_and(runtime_type *this,iterator *a,iterator *b)

{
  bool bVar1;
  bool *pbVar2;
  bool in_CL;
  bool local_39;
  undefined1 local_38 [16];
  
  parse_expr((runtime_type *)(local_38 + 8),a,SUB81(b,0));
  pbVar2 = cs_impl::any::const_val<bool>((any *)(local_38 + 8));
  bVar1 = *pbVar2;
  if (bVar1 == true) {
    parse_expr((runtime_type *)local_38,a,in_CL);
    pbVar2 = cs_impl::any::const_val<bool>((any *)local_38);
    local_39 = *pbVar2;
  }
  else {
    local_39 = false;
  }
  cs_impl::any::make<bool,bool>((any *)this,&local_39);
  if (bVar1 != false) {
    cs_impl::any::recycle((any *)local_38);
  }
  cs_impl::any::recycle((any *)(local_38 + 8));
  return (var)(proxy *)this;
}

Assistant:

var
	runtime_type::parse_and(const tree_type<token_base *>::iterator &a, const tree_type<token_base *>::iterator &b)
	{
		return var::make<boolean>(parse_expr(a).const_val<boolean>() && parse_expr(b).const_val<boolean>());
	}